

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

int __thiscall
CEditor::DoButton_Editor
          (CEditor *this,void *pID,char *pText,int Checked,CUIRect *pRect,int Flags,char *pToolTip)

{
  long lVar1;
  int iVar2;
  undefined4 in_ECX;
  CUI *in_RDX;
  CEditor *in_RDI;
  CUIRect *in_R8;
  float in_R9D;
  long in_FS_OFFSET;
  int in_stack_00000008;
  float in_stack_0000000c;
  vec4 *in_stack_00000010;
  CUIRect *in_stack_00000018;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffb8;
  CUIRect *pText_00;
  undefined4 in_stack_ffffffffffffffc8;
  CEditor *pToolTip_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pText_00 = in_R8;
  pToolTip_00 = in_RDI;
  GetButtonColor((CEditor *)CONCAT44(in_ECX,in_stack_ffffffffffffffc8),in_R8,(int)in_R9D);
  CUIRect::Draw(in_stack_00000018,in_stack_00000010,in_stack_0000000c,in_stack_00000008);
  UI(in_RDI);
  CUI::DoLabel(in_RDX,(CUIRect *)CONCAT44(in_ECX,in_stack_ffffffffffffffc8),(char *)pText_00,in_R9D,
               in_stack_ffffffffffffffb8,(float)((ulong)in_RDI >> 0x20),
               SUB81((ulong)in_RDI >> 0x18,0));
  iVar2 = DoButton_Editor_Common
                    ((CEditor *)CONCAT44(in_ECX,in_stack_ffffffffffffffc8),pText_00,
                     (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffb8),(int)((ulong)in_RDI >> 0x20)
                     ,in_R8,in_stack_ffffffffffffffa4,(char *)pToolTip_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CEditor::DoButton_Editor(const void *pID, const char *pText, int Checked, const CUIRect *pRect, int Flags, const char *pToolTip)
{
	pRect->Draw(GetButtonColor(pID, Checked), 3.0f);
	UI()->DoLabel(pRect, pText, 10.0f, TEXTALIGN_MC);
	return DoButton_Editor_Common(pID, pText, Checked, pRect, Flags, pToolTip);
}